

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O0

bool __thiscall
boost::unit_test::utils::
token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
::get<char_const*>(token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>,_char,_boost::unit_test::utils::ut_detail::default_char_compare<char>,_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::basic_cstring<const_char>,_boost::iterators::forward_traversal_tag>
                   *this,char **begin,char *end)

{
  bool bVar1;
  char *in_RDX;
  char **in_RSI;
  char *in_RDI;
  char *check_point;
  char in_stack_00000037;
  delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
  *in_stack_00000038;
  undefined5 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffcd;
  byte in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  
  basic_cstring<const_char>::clear((basic_cstring<const_char> *)(in_RDI + 8));
  if ((in_RDI[0x48] & 1U) == 0) {
    while( true ) {
      in_stack_ffffffffffffffcf = false;
      if (*in_RSI != in_RDX) {
        in_stack_ffffffffffffffcf =
             ut_detail::
             delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
             operator()(in_stack_00000038,in_stack_00000037);
      }
      if ((bool)in_stack_ffffffffffffffcf == false) break;
      *in_RSI = *in_RSI + 1;
    }
    if (*in_RSI == in_RDX) {
      return false;
    }
    if (*(long *)(in_RDI + 0x50) == 1) {
      while (*in_RSI != in_RDX) {
        ut_detail::token_assigner<boost::iterators::random_access_traversal_tag>::
        append_move<char_const*,boost::unit_test::basic_cstring<char_const>>
                  (in_RSI,(basic_cstring<const_char> *)(in_RDI + 8));
      }
    }
    else {
      bVar1 = ut_detail::
              delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
              operator()(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        ut_detail::token_assigner<boost::iterators::random_access_traversal_tag>::
        append_move<char_const*,boost::unit_test::basic_cstring<char_const>>
                  (in_RSI,(basic_cstring<const_char> *)(in_RDI + 8));
      }
      else {
        while( true ) {
          in_stack_ffffffffffffffce = 0;
          if (*in_RSI != in_RDX) {
            bVar1 = ut_detail::
                    delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                    ::operator()(in_stack_00000038,in_stack_00000037);
            in_stack_ffffffffffffffce = 0;
            if (!bVar1) {
              bVar1 = ut_detail::
                      delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                      ::operator()(in_stack_00000038,in_stack_00000037);
              in_stack_ffffffffffffffce = bVar1 ^ 0xff;
            }
          }
          if ((in_stack_ffffffffffffffce & 1) == 0) break;
          ut_detail::token_assigner<boost::iterators::random_access_traversal_tag>::
          append_move<char_const*,boost::unit_test::basic_cstring<char_const>>
                    (in_RSI,(basic_cstring<const_char> *)(in_RDI + 8));
        }
      }
    }
    *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + -1;
  }
  else {
    if (*in_RSI == in_RDX) {
      if ((in_RDI[0x58] & 1U) != 0) {
        return false;
      }
      in_RDI[0x58] = '\x01';
    }
    bVar1 = ut_detail::
            delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
            operator()(in_stack_00000038,in_stack_00000037);
    if (bVar1) {
      if ((in_RDI[0x58] & 1U) != 0) {
        ut_detail::token_assigner<boost::iterators::random_access_traversal_tag>::
        append_move<char_const*,boost::unit_test::basic_cstring<char_const>>
                  (in_RSI,(basic_cstring<const_char> *)(in_RDI + 8));
      }
      in_RDI[0x58] = (in_RDI[0x58] ^ 0xffU) & 1;
    }
    else if (((in_RDI[0x58] & 1U) == 0) &&
            (bVar1 = ut_detail::
                     delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                     ::operator()(in_stack_00000038,in_stack_00000037), bVar1)) {
      in_RDI[0x58] = '\x01';
    }
    else {
      bVar1 = ut_detail::
              delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
              operator()(in_stack_00000038,in_stack_00000037);
      if (bVar1) {
        *in_RSI = *in_RSI + 1;
      }
      while( true ) {
        in_stack_ffffffffffffffcd = 0;
        if (*in_RSI != in_RDX) {
          bVar1 = ut_detail::
                  delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                  ::operator()(in_stack_00000038,in_stack_00000037);
          in_stack_ffffffffffffffcd = 0;
          if (!bVar1) {
            bVar1 = ut_detail::
                    delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                    ::operator()(in_stack_00000038,in_stack_00000037);
            in_stack_ffffffffffffffcd = bVar1 ^ 0xff;
          }
        }
        if ((in_stack_ffffffffffffffcd & 1) == 0) break;
        ut_detail::token_assigner<boost::iterators::random_access_traversal_tag>::
        append_move<char_const*,boost::unit_test::basic_cstring<char_const>>
                  (in_RSI,(basic_cstring<const_char> *)(in_RDI + 8));
      }
      in_RDI[0x58] = '\x01';
    }
  }
  ut_detail::token_assigner<boost::iterators::random_access_traversal_tag>::
  assign<char_const*,boost::unit_test::basic_cstring<char_const>>
            (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffcf,
                                     CONCAT16(in_stack_ffffffffffffffce,
                                              CONCAT15(in_stack_ffffffffffffffcd,
                                                       in_stack_ffffffffffffffc8))),
             (basic_cstring<const_char> *)0x289f95);
  return true;
}

Assistant:

bool                    get( Iter& begin, Iter end )
    {
        typedef ut_detail::token_assigner<BOOST_DEDUCED_TYPENAME iterator_traversal<Iter>::type> Assigner;
        Iter check_point;

        this->m_value.clear();

        if( !m_keep_empty_tokens ) {
            while( begin != end && m_is_dropped( *begin ) )
                ++begin;

            if( begin == end )
                return false;

            check_point = begin;

            if( m_tokens_left == 1 )
                while( begin != end )
                    Assigner::append_move( begin, this->m_value );
            else if( m_is_kept( *begin ) )
                Assigner::append_move( begin, this->m_value );
            else
                while( begin != end && !m_is_dropped( *begin ) && !m_is_kept( *begin ) )
                    Assigner::append_move( begin, this->m_value );

            --m_tokens_left;
        }
        else { // m_keep_empty_tokens is true
            check_point = begin;

            if( begin == end ) {
                if( m_token_produced )
                    return false;

                m_token_produced = true;
            }
            if( m_is_kept( *begin ) ) {
                if( m_token_produced )
                    Assigner::append_move( begin, this->m_value );

                m_token_produced = !m_token_produced;
            }
            else if( !m_token_produced && m_is_dropped( *begin ) )
                m_token_produced = true;
            else {
                if( m_is_dropped( *begin ) )
                    check_point = ++begin;

                while( begin != end && !m_is_dropped( *begin ) && !m_is_kept( *begin ) )
                    Assigner::append_move( begin, this->m_value );

                m_token_produced = true;
            }
        }

        Assigner::assign( check_point, begin, this->m_value );

        return true;
    }